

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf_tests.cpp
# Opt level: O1

CTransactionRef __thiscall
rbf_tests::make_tx(rbf_tests *this,
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *inputs,vector<long,_std::allocator<long>_> *output_values)

{
  undefined8 *puVar1;
  uchar *puVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer psVar7;
  uint uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar9;
  ulong uVar10;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar11;
  long lVar12;
  long in_FS_OFFSET;
  CTransactionRef CVar13;
  CMutableTransaction tx;
  CScriptWitness witness;
  unsigned_long local_98;
  CMutableTransaction local_90;
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_90);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&local_90.vin,
             (long)(inputs->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(inputs->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            (&local_90.vout,
             (long)(output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  psVar7 = (inputs->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((inputs->
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar7) {
    lVar12 = 0x50;
    lVar9 = 0;
    uVar10 = 0;
    do {
      lVar3 = *(long *)((long)&(psVar7->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar9);
      uVar4 = *(undefined8 *)(lVar3 + 0x39);
      uVar5 = *(undefined8 *)(lVar3 + 0x41);
      uVar6 = *(undefined8 *)(lVar3 + 0x51);
      puVar1 = (undefined8 *)
               ((long)(&((local_90.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start)->prevout).hash + -2) + lVar12);
      *puVar1 = *(undefined8 *)(lVar3 + 0x49);
      puVar1[1] = uVar6;
      puVar2 = ((local_90.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar12 + -0x50;
      *(undefined8 *)puVar2 = uVar4;
      *(undefined8 *)(puVar2 + 8) = uVar5;
      puVar2 = ((local_90.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar12 + -0x30;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
      local_58._8_8_ = (pointer)0x0;
      local_58._16_8_ = (pointer)0x0;
      local_98 = uVar10 + 10;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::emplace_back<unsigned_long>
                ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_58,&local_98);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)(((local_90.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.
                      super_base_blob<256U>.m_data._M_elems + lVar12),
                  (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_58);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)local_58);
      uVar10 = uVar10 + 1;
      psVar7 = (inputs->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x10;
      lVar12 = lVar12 + 0x68;
    } while (uVar10 < (ulong)((long)(inputs->
                                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4)
            );
  }
  if ((output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    lVar9 = 8;
    uVar10 = 0;
    do {
      local_58._16_8_ = (pointer)0x0;
      stack0xffffffffffffffc0 = 0;
      local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
      local_58._8_8_ = (pointer)0x0;
      local_98._0_1_ = 0x5b;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,(iterator)local_58,
                 (uchar *)&local_98);
      uVar8 = uStack_3c - 0x1d;
      if (uStack_3c < 0x1d) {
        uVar8 = uStack_3c;
      }
      ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_;
      if (uStack_3c < 0x1d) {
        ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58;
      }
      local_98 = CONCAT71(local_98._1_7_,0x87);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
                 (uchar *)((long)&ppVar11->_union + (long)(int)uVar8),(uchar *)&local_98);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 ((long)&(local_90.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue + lVar9),
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
      if (0x1c < uStack_3c) {
        free((void *)local_58._0_8_);
        local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
      }
      *(long *)((long)local_90.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar9 + -8) =
           (output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar10];
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x28;
    } while (uVar10 < (ulong)((long)(output_values->super__Vector_base<long,_std::allocator<long>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(output_values->super__Vector_base<long,_std::allocator<long>_>)
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(CTransaction **)this,
             (allocator<CTransaction> *)local_58,&local_90);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_90.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_90.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  CVar13.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar13.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CTransactionRef)CVar13.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static inline CTransactionRef make_tx(const std::vector<CTransactionRef>& inputs,
                                      const std::vector<CAmount>& output_values)
{
    CMutableTransaction tx = CMutableTransaction();
    tx.vin.resize(inputs.size());
    tx.vout.resize(output_values.size());
    for (size_t i = 0; i < inputs.size(); ++i) {
        tx.vin[i].prevout.hash = inputs[i]->GetHash();
        tx.vin[i].prevout.n = 0;
        // Add a witness so wtxid != txid
        CScriptWitness witness;
        witness.stack.emplace_back(i + 10);
        tx.vin[i].scriptWitness = witness;
    }
    for (size_t i = 0; i < output_values.size(); ++i) {
        tx.vout[i].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        tx.vout[i].nValue = output_values[i];
    }
    return MakeTransactionRef(tx);
}